

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_PackFontRangesGatherRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  uchar *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int y1;
  int x1;
  int y0;
  int x0;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  stbtt_pack_range *local_68;
  int *local_60;
  ulong local_58;
  ulong local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (num_ranges < 1) {
    iVar5 = 0;
  }
  else {
    local_58 = (ulong)(uint)num_ranges;
    piVar6 = &rects->h;
    uVar9 = 0;
    iVar5 = 0;
    bVar2 = false;
    local_68 = ranges;
    local_60 = piVar6;
    do {
      local_48 = ranges[uVar9].font_size;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      if (local_48 <= 0.0) {
        uStack_44 = 0x80000000;
        uStack_40 = 0x80000000;
        uStack_3c = 0x80000000;
        local_48 = -local_48;
        uVar7 = (uint)(ushort)(*(ushort *)(info->data + (long)info->head + 0x12) << 8 |
                              *(ushort *)(info->data + (long)info->head + 0x12) >> 8);
      }
      else {
        puVar1 = info->data;
        lVar8 = (long)info->hhea;
        uVar7 = ((int)(short)((ushort)puVar1[lVar8 + 4] << 8) | (uint)puVar1[lVar8 + 5]) -
                ((int)(short)((ushort)puVar1[lVar8 + 6] << 8) | (uint)puVar1[lVar8 + 7]);
      }
      local_48 = local_48 / (float)(int)uVar7;
      ranges[uVar9].h_oversample = (uchar)spc->h_oversample;
      ranges[uVar9].v_oversample = (uchar)spc->v_oversample;
      local_50 = uVar9;
      if (0 < ranges[uVar9].num_chars) {
        piVar6 = piVar6 + (long)iVar5 * 6;
        lVar8 = 0;
        do {
          if (ranges[uVar9].array_of_unicode_codepoints == (int *)0x0) {
            iVar4 = ranges[uVar9].first_unicode_codepoint_in_range + (int)lVar8;
          }
          else {
            iVar4 = ranges[uVar9].array_of_unicode_codepoints[lVar8];
          }
          iVar4 = stbtt_FindGlyphIndex(info,iVar4);
          bVar3 = bVar2;
          if ((iVar4 == 0) && (bVar3 = true, spc->skip_missing != 0 || bVar2)) {
            *(undefined8 *)(piVar6 + -1) = 0;
          }
          else {
            stbtt_GetGlyphBitmapBoxSubpixel
                      (info,iVar4,(float)spc->h_oversample * local_48,
                       (float)spc->v_oversample * local_48,0.0,0.0,&local_6c,&local_70,&local_74,
                       &local_78);
            iVar4 = spc->padding + -1;
            piVar6[-1] = ((local_74 + iVar4) - local_6c) + spc->h_oversample;
            *piVar6 = ((iVar4 + local_78) - local_70) + spc->v_oversample;
            bVar2 = bVar3;
          }
          lVar8 = lVar8 + 1;
          piVar6 = piVar6 + 6;
        } while (lVar8 < ranges[uVar9].num_chars);
        iVar5 = iVar5 + (int)lVar8;
        ranges = local_68;
        piVar6 = local_60;
      }
      uVar9 = local_50 + 1;
    } while (uVar9 != local_58);
  }
  return iVar5;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesGatherRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k;
   int missing_glyph_added = 0;

   k=0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      ranges[i].h_oversample = (unsigned char) spc->h_oversample;
      ranges[i].v_oversample = (unsigned char) spc->v_oversample;
      for (j=0; j < ranges[i].num_chars; ++j) {
         int x0,y0,x1,y1;
         int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
         int glyph = stbtt_FindGlyphIndex(info, codepoint);
         if (glyph == 0 && (spc->skip_missing || missing_glyph_added)) {
            rects[k].w = rects[k].h = 0;
         } else {
            stbtt_GetGlyphBitmapBoxSubpixel(info,glyph,
                                            scale * spc->h_oversample,
                                            scale * spc->v_oversample,
                                            0,0,
                                            &x0,&y0,&x1,&y1);
            rects[k].w = (stbrp_coord) (x1-x0 + spc->padding + spc->h_oversample-1);
            rects[k].h = (stbrp_coord) (y1-y0 + spc->padding + spc->v_oversample-1);
            if (glyph == 0)
               missing_glyph_added = 1;
         }
         ++k;
      }
   }

   return k;
}